

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::declareTypeDefaults
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  bool bVar1;
  TPublicType *publicType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if ((publicType->basicType == EbtAtomicUint) &&
     (bVar1 = TQualifier::hasBinding(&publicType->qualifier), bVar1)) {
    if (((uint)((ulong)*(undefined8 *)&(publicType->qualifier).field_0x1c >> 0x20) & 0xffff) <
        (uint)(this->resources).maxAtomicCounterBindings) {
      bVar1 = TQualifier::hasOffset(&publicType->qualifier);
      if (bVar1) {
        this->atomicUintOffsets
        [(uint)((ulong)*(undefined8 *)&(publicType->qualifier).field_0x1c >> 0x20) & 0xffff] =
             (publicType->qualifier).layoutOffset;
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"atomic_uint binding is too large","binding","");
    }
  }
  else {
    if (publicType->arraySizes != (TArraySizes *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"expect an array name","");
    }
    bVar1 = TQualifier::hasLayout(&publicType->qualifier);
    if ((bVar1) && (bVar1 = TQualifier::hasBufferReference(&publicType->qualifier), !bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,"useless application of layout qualifier","layout","");
    }
  }
  return;
}

Assistant:

void TParseContext::declareTypeDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.basicType == EbtAtomicUint && publicType.qualifier.hasBinding()) {
        if (publicType.qualifier.layoutBinding >= (unsigned int)resources.maxAtomicCounterBindings) {
            error(loc, "atomic_uint binding is too large", "binding", "");
            return;
        }
        if (publicType.qualifier.hasOffset())
            atomicUintOffsets[publicType.qualifier.layoutBinding] = publicType.qualifier.layoutOffset;
        return;
    }

    if (publicType.arraySizes) {
        error(loc, "expect an array name", "", "");
    }

    if (publicType.qualifier.hasLayout() && !publicType.qualifier.hasBufferReference())
        warn(loc, "useless application of layout qualifier", "layout", "");
}